

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exttpose.h
# Opt level: O1

void __thiscall ExttposeArgument::parse_args(ExttposeArgument *this,int argc,char **argv)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  multiset<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  _Rb_tree_header *p_Var3;
  byte bVar4;
  uint uVar5;
  pointer pcVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  long lVar7;
  const_iterator cVar8;
  runtime_error *prVar9;
  char cVar10;
  initializer_list<const_char_*const> init_list;
  ifstream inconff;
  parser cmdl;
  string local_348;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_320;
  undefined1 local_318 [520];
  parser local_110;
  
  argh::parser::parser(&local_110,argc,argv,2);
  local_348.field_2._M_allocated_capacity = (long)"getconf needs valid value of -i and -o" + 0x25;
  local_348._M_dataplus._M_p = "s";
  local_348._M_string_length = 0x120005;
  init_list._M_len = 3;
  init_list._M_array = (iterator)&local_348;
  argh::parser::operator()((string_stream *)local_318,&local_110,init_list);
  bVar4 = local_318[*(long *)(local_318._0_8_ + -0x18) + 0x20];
  std::__cxx11::istringstream::~istringstream((istringstream *)local_318);
  std::ios_base::~ios_base((ios_base *)(local_318 + 0x78));
  if ((bVar4 & 5) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"usage: exttpose [OPTION]... -i<infile> -o<outfile> -s\n",0x36)
    ;
    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar9,"exttpose needs valid value of -i -o and -s");
    __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  paVar1 = &local_348.field_2;
  local_348._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_348,"i","");
  argh::parser::operator()((string_stream *)local_318,&local_110,&local_348);
  std::operator>>((istream *)local_318,(string *)&this->name);
  std::__cxx11::istringstream::~istringstream((istringstream *)local_318);
  std::ios_base::~ios_base((ios_base *)(local_318 + 0x78));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_348._M_dataplus._M_p != paVar1) {
    operator_delete(local_348._M_dataplus._M_p);
  }
  pcVar2 = local_318 + 0x10;
  pcVar6 = (this->name)._M_dataplus._M_p;
  local_318._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_318,pcVar6,pcVar6 + (this->name)._M_string_length);
  std::__cxx11::string::append(local_318);
  std::__cxx11::string::operator=((string *)this,(string *)local_318);
  if ((pointer)local_318._0_8_ != pcVar2) {
    operator_delete((void *)local_318._0_8_);
  }
  pcVar6 = (this->name)._M_dataplus._M_p;
  local_318._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_318,pcVar6,pcVar6 + (this->name)._M_string_length);
  std::__cxx11::string::append(local_318);
  std::__cxx11::string::operator=((string *)&this->inconfn,(string *)local_318);
  if ((pointer)local_318._0_8_ != pcVar2) {
    operator_delete((void *)local_318._0_8_);
  }
  local_348._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_348,"o","");
  argh::parser::operator()((string_stream *)local_318,&local_110,&local_348);
  std::operator>>((istream *)local_318,(string *)&this->name);
  std::__cxx11::istringstream::~istringstream((istringstream *)local_318);
  std::ios_base::~ios_base((ios_base *)(local_318 + 0x78));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_348._M_dataplus._M_p != paVar1) {
    operator_delete(local_348._M_dataplus._M_p);
  }
  pcVar6 = (this->name)._M_dataplus._M_p;
  local_318._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_318,pcVar6,pcVar6 + (this->name)._M_string_length);
  std::__cxx11::string::append(local_318);
  std::__cxx11::string::operator=((string *)&this->output,(string *)local_318);
  if ((pointer)local_318._0_8_ != pcVar2) {
    operator_delete((void *)local_318._0_8_);
  }
  pcVar6 = (this->name)._M_dataplus._M_p;
  local_318._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_318,pcVar6,pcVar6 + (this->name)._M_string_length);
  std::__cxx11::string::append(local_318);
  std::__cxx11::string::operator=((string *)&this->idxfn,(string *)local_318);
  if ((pointer)local_318._0_8_ != pcVar2) {
    operator_delete((void *)local_318._0_8_);
  }
  pcVar6 = (this->name)._M_dataplus._M_p;
  local_318._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_318,pcVar6,pcVar6 + (this->name)._M_string_length);
  std::__cxx11::string::append(local_318);
  std::__cxx11::string::operator=((string *)&this->it2fn,(string *)local_318);
  if ((pointer)local_318._0_8_ != pcVar2) {
    operator_delete((void *)local_318._0_8_);
  }
  pcVar6 = (this->name)._M_dataplus._M_p;
  local_318._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_318,pcVar6,pcVar6 + (this->name)._M_string_length);
  std::__cxx11::string::append(local_318);
  std::__cxx11::string::operator=((string *)&this->seqfn,(string *)local_318);
  if ((pointer)local_318._0_8_ != pcVar2) {
    operator_delete((void *)local_318._0_8_);
  }
  pcVar6 = (this->name)._M_dataplus._M_p;
  local_318._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_318,pcVar6,pcVar6 + (this->name)._M_string_length);
  std::__cxx11::string::append(local_318);
  std::__cxx11::string::operator=((string *)&this->tmpfn,(string *)local_318);
  if ((pointer)local_318._0_8_ != pcVar2) {
    operator_delete((void *)local_318._0_8_);
  }
  local_348._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_348,"p","");
  argh::parser::operator()((string_stream *)local_318,&local_110,&local_348);
  std::istream::operator>>((istream *)local_318,&this->num_partitions);
  std::__cxx11::istringstream::~istringstream((istringstream *)local_318);
  std::ios_base::~ios_base((ios_base *)(local_318 + 0x78));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_348._M_dataplus._M_p != paVar1) {
    operator_delete(local_348._M_dataplus._M_p);
  }
  local_348._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_348,"s","");
  argh::parser::operator()((string_stream *)local_318,&local_110,&local_348);
  std::istream::_M_extract<double>((double *)local_318);
  std::__cxx11::istringstream::~istringstream((istringstream *)local_318);
  std::ios_base::~ios_base((ios_base *)(local_318 + 0x78));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_348._M_dataplus._M_p != paVar1) {
    operator_delete(local_348._M_dataplus._M_p);
  }
  local_348._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_348,"a","");
  local_320 = &this->inconfn;
  argh::parser::operator()((string_stream *)local_318,&local_110,&local_348);
  uVar5 = *(uint *)(local_318 + *(long *)(local_318._0_8_ + -0x18) + 0x20);
  std::__cxx11::istringstream::~istringstream((istringstream *)local_318);
  std::ios_base::~ios_base((ios_base *)(local_318 + 0x78));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_348._M_dataplus._M_p != paVar1) {
    operator_delete(local_348._M_dataplus._M_p);
  }
  if ((uVar5 & 5) == 0) {
    this->use_seq = 0;
    local_348._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_348,"a","");
    argh::parser::operator()((string_stream *)local_318,&local_110,&local_348);
    std::istream::operator>>((istream *)local_318,&this->write_only_fcnt);
    std::__cxx11::istringstream::~istringstream((istringstream *)local_318);
    std::ios_base::~ios_base((ios_base *)(local_318 + 0x78));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_348._M_dataplus._M_p != paVar1) {
      operator_delete(local_348._M_dataplus._M_p);
    }
  }
  local_348._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_348,"d","");
  lVar7 = std::__cxx11::string::find_first_not_of((char)&local_348,0x2d);
  if (lVar7 == -1) {
    local_318._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_318,local_348._M_dataplus._M_p,
               local_348._M_dataplus._M_p + local_348._M_string_length);
  }
  else {
    std::__cxx11::string::substr((ulong)local_318,(ulong)&local_348);
  }
  this_00 = &local_110.flags_;
  cVar8 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::find(&this_00->_M_t,(key_type *)local_318);
  if ((pointer)local_318._0_8_ != pcVar2) {
    operator_delete((void *)local_318._0_8_);
  }
  p_Var3 = &local_110.flags_._M_t._M_impl.super__Rb_tree_header;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_348._M_dataplus._M_p != paVar1) {
    operator_delete(local_348._M_dataplus._M_p);
  }
  if (p_Var3 != (_Rb_tree_header *)cVar8._M_node) {
    this->use_diff = '\x01';
  }
  local_348._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_348,"l","");
  cVar10 = (char)&local_348;
  lVar7 = std::__cxx11::string::find_first_not_of(cVar10,0x2d);
  if (lVar7 == -1) {
    local_318._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_318,local_348._M_dataplus._M_p,
               local_348._M_dataplus._M_p + local_348._M_string_length);
  }
  else {
    std::__cxx11::string::substr((ulong)local_318,(ulong)&local_348);
  }
  cVar8 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::find(&this_00->_M_t,(key_type *)local_318);
  if ((pointer)local_318._0_8_ != pcVar2) {
    operator_delete((void *)local_318._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_348._M_dataplus._M_p != paVar1) {
    operator_delete(local_348._M_dataplus._M_p);
  }
  if (p_Var3 != (_Rb_tree_header *)cVar8._M_node) {
    this->do_l2 = 0;
  }
  local_348._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_348,"v","");
  lVar7 = std::__cxx11::string::find_first_not_of(cVar10,0x2d);
  if (lVar7 == -1) {
    local_318._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_318,local_348._M_dataplus._M_p,
               local_348._M_dataplus._M_p + local_348._M_string_length);
  }
  else {
    std::__cxx11::string::substr((ulong)local_318,(ulong)&local_348);
  }
  cVar8 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::find(&this_00->_M_t,(key_type *)local_318);
  if ((pointer)local_318._0_8_ != pcVar2) {
    operator_delete((void *)local_318._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_348._M_dataplus._M_p != paVar1) {
    operator_delete(local_348._M_dataplus._M_p);
  }
  if (p_Var3 != (_Rb_tree_header *)cVar8._M_node) {
    this->do_invert = 0;
  }
  local_348._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_348,"f","");
  lVar7 = std::__cxx11::string::find_first_not_of(cVar10,0x2d);
  if (lVar7 == -1) {
    local_318._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_318,local_348._M_dataplus._M_p,
               local_348._M_dataplus._M_p + local_348._M_string_length);
  }
  else {
    std::__cxx11::string::substr((ulong)local_318,(ulong)&local_348);
  }
  cVar8 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::find(&this_00->_M_t,(key_type *)local_318);
  if ((pointer)local_318._0_8_ != pcVar2) {
    operator_delete((void *)local_318._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_348._M_dataplus._M_p != paVar1) {
    operator_delete(local_348._M_dataplus._M_p);
  }
  if (p_Var3 != (_Rb_tree_header *)cVar8._M_node) {
    this->use_newformat = '\0';
  }
  local_348._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_348,"m","");
  argh::parser::operator()((string_stream *)local_318,&local_110,&local_348);
  uVar5 = *(uint *)(local_318 + *(long *)(local_318._0_8_ + -0x18) + 0x20);
  std::__cxx11::istringstream::~istringstream((istringstream *)local_318);
  std::ios_base::~ios_base((ios_base *)(local_318 + 0x78));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_348._M_dataplus._M_p != paVar1) {
    operator_delete(local_348._M_dataplus._M_p);
  }
  if ((uVar5 & 5) == 0) {
    local_348._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_348,"m","");
    argh::parser::operator()((string_stream *)local_318,&local_110,&local_348);
    std::istream::_M_extract<long>((long *)local_318);
    std::__cxx11::istringstream::~istringstream((istringstream *)local_318);
    std::ios_base::~ios_base((ios_base *)(local_318 + 0x78));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_348._M_dataplus._M_p != paVar1) {
      operator_delete(local_348._M_dataplus._M_p);
    }
    this->AMEM = this->AMEM * 0x12d000;
  }
  local_348._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_348,"x","");
  lVar7 = std::__cxx11::string::find_first_not_of(cVar10,0x2d);
  if (lVar7 == -1) {
    local_318._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_318,local_348._M_dataplus._M_p,
               local_348._M_dataplus._M_p + local_348._M_string_length);
  }
  else {
    std::__cxx11::string::substr((ulong)local_318,(ulong)&local_348);
  }
  cVar8 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::find(&this_00->_M_t,(key_type *)local_318);
  if ((pointer)local_318._0_8_ != pcVar2) {
    operator_delete((void *)local_318._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_348._M_dataplus._M_p != paVar1) {
    operator_delete(local_348._M_dataplus._M_p);
  }
  __rhs = local_320;
  if (p_Var3 != (_Rb_tree_header *)cVar8._M_node) {
    this->no_minus_off = '\x01';
  }
  std::ifstream::ifstream(local_318,(string *)local_320,_S_bin);
  if ((local_318[*(long *)(local_318._0_8_ + -0x18) + 0x20] & 5) == 0) {
    if (this->use_seq == 0) {
      std::istream::read(local_318,(long)&this->DBASE_NUM_TRANS);
      std::istream::read(local_318,(long)&this->DBASE_MAXITEM);
      lVar7 = 0x114;
    }
    else {
      std::istream::read(local_318,(long)&this->DBASE_NUM_TRANS);
      std::istream::read(local_318,(long)&this->DBASE_MAXITEM);
      std::istream::read(local_318,(long)&this->DBASE_AVG_CUST_SZ);
      lVar7 = 0x11c;
      std::istream::read(local_318,(long)&this->DBASE_AVG_TRANS_SZ);
    }
    std::istream::read(local_318,(long)&(this->input)._M_dataplus._M_p + lVar7);
    if (this->use_diff != '\0') {
      this->use_seq = 0;
      this->num_partitions = 1;
    }
    if (this->use_seq != 0) {
      this->write_only_fcnt = 0;
    }
    std::ifstream::~ifstream(local_318);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110.empty_._M_dataplus._M_p != &local_110.empty_.field_2) {
      operator_delete(local_110.empty_._M_dataplus._M_p);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_110.registeredParams_._M_t);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&this_00->_M_t);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_110.pos_args_);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&local_110.params_._M_t);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_110.args_);
    return;
  }
  prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_348,"ERROR: Can\'t read conf file: ",__rhs);
  std::runtime_error::runtime_error(prVar9,(string *)&local_348);
  __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void parse_args(int argc, char **argv) {
        auto cmdl = argh::parser(argc, argv, argh::parser::PREFER_PARAM_FOR_UNREG_OPTION);
        if (!cmdl({"s", "i", "o"})) {
            cerr << "usage: exttpose [OPTION]... -i<infile> -o<outfile> -s\n";
            throw runtime_error("exttpose needs valid value of -i -o and -s");
        }
        cmdl("i") >> name;
        input = name + ".data";
        inconfn = name + ".conf";
        cmdl("o") >> name;
        output = name + ".tpose";
        idxfn = name + ".idx";
        it2fn = name + ".2it";
        seqfn = name + ".2seq";
        tmpfn = name + ".tmp";
        cmdl("p") >> num_partitions;
        cmdl("s") >> MINSUP_PER;
        if (cmdl("a")) {
            use_seq = 0;
            cmdl("a") >> write_only_fcnt;
        }
        if (cmdl["d"]) use_diff = 1;
        if (cmdl["l"]) do_l2 = 0;
        if (cmdl["v"]) do_invert = 0;
        if (cmdl["f"]) use_newformat = 0;
        if (cmdl("m")) {
            cmdl("m") >> AMEM;
            AMEM *= MEG;
        }
        if (cmdl["x"]) no_minus_off = 1;

        ifstream inconff(inconfn, ios::binary);
        if (!inconff) {
            throw runtime_error("ERROR: Can\'t read conf file: " + inconfn);
        }

        if (use_seq) {
            inconff.read((char *) &DBASE_NUM_TRANS, INT_SIZE);
            inconff.read((char *) &DBASE_MAXITEM, INT_SIZE);
            inconff.read((char *) &DBASE_AVG_CUST_SZ, sizeof(float));
            inconff.read((char *) &DBASE_AVG_TRANS_SZ, sizeof(float));
            inconff.read((char *) &DBASE_TOT_TRANS, INT_SIZE);
        } else {
            inconff.read((char *) &DBASE_NUM_TRANS, INT_SIZE);
            inconff.read((char *) &DBASE_MAXITEM, INT_SIZE);
            inconff.read((char *) &DBASE_AVG_TRANS_SZ, sizeof(float));
        }

        if (use_diff) {
            use_seq = 0;
            num_partitions = 1;
        }
        if (use_seq) {
            write_only_fcnt = 0;
        }
    }